

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O1

string * __thiscall
base64::encode_abi_cxx11_
          (string *__return_storage_ptr__,base64 *this,char *buffer,size_t size,alphabet alphabet)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  encode<char_const*,std::back_insert_iterator<std::__cxx11::string>>
            ((char *)this,buffer + (long)this,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__,(alphabet)size);
  return __return_storage_ptr__;
}

Assistant:

static std::string encode(const char* buffer, std::size_t size, alphabet alphabet = alphabet::standard)
    {
        std::string result;

        result.reserve(required_encode_size(size) + 1);

        encode(buffer, buffer + size, std::back_inserter(result), alphabet);

        return result;
    }